

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O0

void __thiscall cmStringReplaceHelper::ParseReplaceExpression(cmStringReplaceHelper *this)

{
  size_type sVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  string local_230 [32];
  string local_210 [32];
  ostringstream local_1f0 [8];
  ostringstream error;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_type local_20;
  size_type r;
  size_type l;
  cmStringReplaceHelper *this_local;
  
  r = 0;
  l = (size_type)this;
  do {
    sVar1 = r;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= sVar1) {
      return;
    }
    local_20 = std::__cxx11::string::find((char)this + '\x18',0x5c);
    if (local_20 == 0xffffffffffffffff) {
      local_20 = std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_40,(ulong)&this->ReplaceExpression);
      std::
      vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
      ::emplace_back<std::__cxx11::string>
                ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                  *)&this->Replacements,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      if (local_20 != r) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&this->ReplaceExpression);
        std::
        vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
        ::emplace_back<std::__cxx11::string>
                  ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                    *)&this->Replacements,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      sVar1 = local_20;
      lVar3 = std::__cxx11::string::length();
      if (sVar1 == lVar3 - 1U) {
        this->ValidReplaceExpression = false;
        std::__cxx11::string::operator=((string *)this,"replace-expression ends in a backslash");
        return;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->ReplaceExpression);
      if ((*pcVar4 < '0') ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->ReplaceExpression),
         '9' < *pcVar4)) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->ReplaceExpression);
        if (*pcVar4 == 'n') {
          std::
          vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
          ::emplace_back<char_const(&)[2]>
                    ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                      *)&this->Replacements,(char (*) [2])0x816ec9);
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->ReplaceExpression);
          if (*pcVar4 != '\\') {
            this->ValidReplaceExpression = false;
            std::__cxx11::ostringstream::ostringstream(local_1f0);
            poVar5 = std::operator<<((ostream *)local_1f0,"Unknown escape \"");
            std::__cxx11::string::substr((ulong)local_210,(ulong)&this->ReplaceExpression);
            poVar5 = std::operator<<(poVar5,local_210);
            std::operator<<(poVar5,"\" in replace-expression");
            std::__cxx11::string::~string(local_210);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)this,local_230);
            std::__cxx11::string::~string(local_230);
            std::__cxx11::ostringstream::~ostringstream(local_1f0);
            return;
          }
          std::
          vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
          ::emplace_back<char_const(&)[2]>
                    ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                      *)&this->Replacements,(char (*) [2])0x7dec29);
        }
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->ReplaceExpression);
        local_74 = *pcVar4 + -0x30;
        std::
        vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
        ::emplace_back<int>(&this->Replacements,&local_74);
      }
      local_20 = local_20 + 2;
    }
    r = local_20;
  } while( true );
}

Assistant:

void cmStringReplaceHelper::ParseReplaceExpression()
{
  std::string::size_type l = 0;
  while (l < this->ReplaceExpression.length()) {
    auto r = this->ReplaceExpression.find('\\', l);
    if (r == std::string::npos) {
      r = this->ReplaceExpression.length();
      this->Replacements.emplace_back(
        this->ReplaceExpression.substr(l, r - l));
    } else {
      if (r - l > 0) {
        this->Replacements.emplace_back(
          this->ReplaceExpression.substr(l, r - l));
      }
      if (r == (this->ReplaceExpression.length() - 1)) {
        this->ValidReplaceExpression = false;
        this->ErrorString = "replace-expression ends in a backslash";
        return;
      }
      if ((this->ReplaceExpression[r + 1] >= '0') &&
          (this->ReplaceExpression[r + 1] <= '9')) {
        this->Replacements.emplace_back(this->ReplaceExpression[r + 1] - '0');
      } else if (this->ReplaceExpression[r + 1] == 'n') {
        this->Replacements.emplace_back("\n");
      } else if (this->ReplaceExpression[r + 1] == '\\') {
        this->Replacements.emplace_back("\\");
      } else {
        this->ValidReplaceExpression = false;
        std::ostringstream error;
        error << "Unknown escape \"" << this->ReplaceExpression.substr(r, 2)
              << "\" in replace-expression";
        this->ErrorString = error.str();
        return;
      }
      r += 2;
    }
    l = r;
  }
}